

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
* __thiscall
lf::mesh::utils::internal::UnaryOpMinus::operator()
          (vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
           *__return_storage_ptr__,UnaryOpMinus *this,
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          *u,int param_2)

{
  PointerType pdVar1;
  PointerType pdVar2;
  pointer dataPtr;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  variable_if_dynamic<long,__1> vVar6;
  long lVar7;
  ulong uVar8;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> rm;
  Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> um;
  assign_op<double,_double> local_a9;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_a8;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> local_88;
  MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_68;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_48;
  
  dataPtr = (u->
            super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  Eigen::
  MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase(&local_68,(PointerType)dataPtr,1,
          (long)(u->
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)dataPtr >> 3);
  std::
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  ::vector(&local_a8,
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_48);
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0> *
          )&local_88,
          (PointerType)
          local_a8.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start,1,
          (long)(u->
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(u->
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3);
  local_48.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_cols.m_value = local_68.m_cols.m_value;
  local_48.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = local_68.m_data;
  local_48.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ._8_8_ = local_68._8_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>const,0,Eigen::Stride<0,0>>const>,double,double>
            (&local_88,&local_48,&local_a9);
  vVar6.m_value =
       local_88.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  if ((((ulong)local_88.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data & 7) == 0) &&
     (vVar6.m_value =
           (long)((uint)((ulong)local_88.
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_data >> 3) & 1),
     local_88.
     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
     m_cols.m_value <= vVar6.m_value)) {
    vVar6.m_value =
         local_88.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
  }
  lVar7 = local_88.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value - vVar6.m_value;
  if (0 < vVar6.m_value) {
    uVar8 = 0;
    do {
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_data[uVar8] = -local_68.m_data[uVar8];
      uVar8 = uVar8 + 1;
    } while (vVar6.m_value != uVar8);
  }
  uVar8 = (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU) + vVar6.m_value;
  if (1 < lVar7) {
    do {
      pdVar1 = local_68.m_data + vVar6.m_value;
      uVar3 = *(uint *)((long)pdVar1 + 4);
      uVar4 = *(undefined4 *)(pdVar1 + 1);
      uVar5 = *(uint *)((long)pdVar1 + 0xc);
      pdVar2 = local_88.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data + vVar6.m_value;
      *(undefined4 *)pdVar2 = *(undefined4 *)pdVar1;
      *(uint *)((long)pdVar2 + 4) = uVar3 ^ 0x80000000;
      *(undefined4 *)(pdVar2 + 1) = uVar4;
      *(uint *)((long)pdVar2 + 0xc) = uVar5 ^ 0x80000000;
      vVar6.m_value = vVar6.m_value + 2;
    } while (vVar6.m_value < (long)uVar8);
  }
  if ((long)uVar8 <
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_cols.m_value) {
    do {
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_data[uVar8] = -local_68.m_data[uVar8];
      uVar8 = uVar8 + 1;
    } while (local_88.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value != uVar8);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_a8.
       super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.
       super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    if constexpr (R == 0 || C == 0) {  // NOLINT
      // result vector is empty
      return u;
    }
    if constexpr (R != Eigen::Dynamic && C != Eigen::Dynamic) {
      // matrix size is known at compile time
      const Eigen::Map<const Eigen::Matrix<S, 1, Eigen::Dynamic>> um(
          &u[0](0, 0), 1, u.size() * R * C);
      std::vector<Eigen::Matrix<S, R, C, O, MR, MC>> result(u.size());
      Eigen::Map<Eigen::Matrix<S, 1, Eigen::Dynamic>> rm(&result[0](0, 0), 1,
                                                         u.size() * R * C);
      rm = -um;
      return result;
    } else {
      // matrix size is dynamic
      std::vector<Eigen::Matrix<S, R, C, O, MR, MC>> result(u.size());
      for (int i = 0; i < u.size(); ++i) {
        result[i] = -u[i];
      }
      return result;
    }
  }